

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O3

char * __thiscall FSSResourceModel::index(FSSResourceModel *this,char *__s,int __c)

{
  undefined4 in_ECX;
  ulong uVar1;
  int *in_R8;
  
  if (((*in_R8 < 0) || (in_R8[1] < 0)) || (*(long *)(in_R8 + 4) == 0)) {
    uVar1 = (ulong)(__c + 1);
  }
  else {
    uVar1 = (ulong)*(byte *)(in_R8 + 2) | (long)(__c * 0x10000 + 0x10000);
  }
  *(int *)this = __c;
  *(undefined4 *)&this->field_0x4 = in_ECX;
  *(ulong *)&this->field_0x8 = uVar1;
  *(char **)(this + 1) = __s;
  return (char *)this;
}

Assistant:

QModelIndex
FSSResourceModel::index(int row, int column,
                        const QModelIndex &parent) const {
  if (parent.isValid()) {
    return createIndex(row, column,
                       ((row+1) << 16) |
                       (parent.internalId() & 0xFF));
  } else {
    return createIndex(row, column, row+1);
  }
}